

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O3

StringMapEntry<bool> * __thiscall
llvm::StringMapEntry<bool>::Create<llvm::MallocAllocator,bool>
          (StringMapEntry<bool> *this,StringRef Key,MallocAllocator *Allocator,bool *InitVals)

{
  StringMapEntry<bool> *pSVar1;
  char *__n;
  
  __n = Key.Data;
  pSVar1 = (StringMapEntry<bool> *)malloc((size_t)(__n + 0x11));
  if (pSVar1 == (StringMapEntry<bool> *)0x0) {
    report_bad_alloc_error("Allocation failed",true);
  }
  (pSVar1->super_StringMapEntryBase).StrLen = (size_t)__n;
  pSVar1->second = (bool)*Allocator;
  if (__n != (char *)0x0) {
    memcpy(pSVar1 + 1,this,(size_t)__n);
  }
  *(char *)((long)&pSVar1[1].super_StringMapEntryBase.StrLen + (long)__n) = '\0';
  return pSVar1;
}

Assistant:

static StringMapEntry *Create(StringRef Key, AllocatorTy &Allocator,
                                InitTy &&... InitVals) {
    size_t KeyLength = Key.size();

    // Allocate a new item with space for the string at the end and a null
    // terminator.
    size_t AllocSize = sizeof(StringMapEntry) + KeyLength + 1;
    size_t Alignment = alignof(StringMapEntry);

    StringMapEntry *NewItem =
      static_cast<StringMapEntry*>(Allocator.Allocate(AllocSize,Alignment));
    assert(NewItem && "Unhandled out-of-memory");

    // Construct the value.
    new (NewItem) StringMapEntry(KeyLength, std::forward<InitTy>(InitVals)...);

    // Copy the string information.
    char *StrBuffer = const_cast<char*>(NewItem->getKeyData());
    if (KeyLength > 0)
      memcpy(StrBuffer, Key.data(), KeyLength);
    StrBuffer[KeyLength] = 0;  // Null terminate for convenience of clients.
    return NewItem;
  }